

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O0

void GetScriptingCommands(cmState *state)

{
  cmState *pcVar1;
  cmCommand *pcVar2;
  cmCMakeMinimumRequired *this;
  cmConfigureFileCommand *this_00;
  cmFindPackageCommand *this_01;
  cmGetPropertyCommand *this_02;
  cmSetPropertyCommand *this_03;
  cmVariableWatchCommand *this_04;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmState *local_10;
  cmState *state_local;
  
  local_10 = state;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"break",&local_31);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmBreakCommand::cmBreakCommand((cmBreakCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_30,pcVar2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"cmake_minimum_required",&local_69);
  this = (cmCMakeMinimumRequired *)operator_new(0x48);
  cmCMakeMinimumRequired::cmCMakeMinimumRequired(this);
  cmState::AddBuiltinCommand(pcVar1,&local_68,(cmCommand *)this);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"cmake_policy",&local_91);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmCMakePolicyCommand::cmCMakePolicyCommand((cmCMakePolicyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_90,pcVar2);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"configure_file",&local_b9)
  ;
  this_00 = (cmConfigureFileCommand *)operator_new(0x80);
  cmConfigureFileCommand::cmConfigureFileCommand(this_00);
  cmState::AddBuiltinCommand(pcVar1,&local_b8,(cmCommand *)this_00);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"continue",&local_e1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmContinueCommand::cmContinueCommand((cmContinueCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"exec_program",&local_109)
  ;
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmExecProgramCommand::cmExecProgramCommand((cmExecProgramCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_108,pcVar2);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"execute_process",&local_131);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmExecuteProcessCommand::cmExecuteProcessCommand((cmExecuteProcessCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_130,pcVar2);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"file",&local_159);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmFileCommand::cmFileCommand((cmFileCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_158,pcVar2);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"find_file",&local_181);
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindFileCommand::cmFindFileCommand((cmFindFileCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_180,pcVar2);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"find_library",&local_1a9)
  ;
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_1a8,pcVar2);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"find_package",&local_1d1)
  ;
  this_01 = (cmFindPackageCommand *)operator_new(0x388);
  cmFindPackageCommand::cmFindPackageCommand(this_01);
  cmState::AddBuiltinCommand(pcVar1,&local_1d0,(cmCommand *)this_01);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"find_path",&local_1f9);
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_1f8,pcVar2);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"find_program",&local_221)
  ;
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindProgramCommand::cmFindProgramCommand((cmFindProgramCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_220,pcVar2);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"foreach",&local_249);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmForEachCommand::cmForEachCommand((cmForEachCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_248,pcVar2);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"function",&local_271);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmFunctionCommand::cmFunctionCommand((cmFunctionCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_270,pcVar2);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"get_cmake_property",&local_299);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetCMakePropertyCommand::cmGetCMakePropertyCommand((cmGetCMakePropertyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_298,pcVar2);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"get_directory_property",&local_2c1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetDirectoryPropertyCommand::cmGetDirectoryPropertyCommand
            ((cmGetDirectoryPropertyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_2c0,pcVar2);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"get_filename_component",&local_2e9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetFilenameComponentCommand::cmGetFilenameComponentCommand
            ((cmGetFilenameComponentCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_2e8,pcVar2);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"get_property",&local_311)
  ;
  this_02 = (cmGetPropertyCommand *)operator_new(0x98);
  cmGetPropertyCommand::cmGetPropertyCommand(this_02);
  cmState::AddBuiltinCommand(pcVar1,&local_310,(cmCommand *)this_02);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"if",&local_339);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIfCommand::cmIfCommand((cmIfCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_338,pcVar2);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"include",&local_361);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIncludeCommand::cmIncludeCommand((cmIncludeCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_360,pcVar2);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"include_guard",&local_389);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIncludeGuardCommand::cmIncludeGuardCommand((cmIncludeGuardCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_388,pcVar2);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"list",&local_3b1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmListCommand::cmListCommand((cmListCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_3b0,pcVar2);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"macro",&local_3d9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmMacroCommand::cmMacroCommand((cmMacroCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_3d8,pcVar2);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"make_directory",&local_401);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmMakeDirectoryCommand::cmMakeDirectoryCommand((cmMakeDirectoryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_400,pcVar2);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"mark_as_advanced",&local_429);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmMarkAsAdvancedCommand::cmMarkAsAdvancedCommand((cmMarkAsAdvancedCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_428,pcVar2);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"math",&local_451);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmMathCommand::cmMathCommand((cmMathCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_450,pcVar2);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"message",&local_479);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmMessageCommand::cmMessageCommand((cmMessageCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_478,pcVar2);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"option",&local_4a1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmOptionCommand::cmOptionCommand((cmOptionCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4a0,pcVar2);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"cmake_parse_arguments",&local_4c9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmParseArgumentsCommand::cmParseArgumentsCommand((cmParseArgumentsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4c8,pcVar2);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"return",&local_4f1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmReturnCommand::cmReturnCommand((cmReturnCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4f0,pcVar2);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"separate_arguments",&local_519);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSeparateArgumentsCommand::cmSeparateArgumentsCommand((cmSeparateArgumentsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_518,pcVar2);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"set",&local_541);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSetCommand::cmSetCommand((cmSetCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_540,pcVar2);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"set_directory_properties",&local_569);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSetDirectoryPropertiesCommand::cmSetDirectoryPropertiesCommand
            ((cmSetDirectoryPropertiesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_568,pcVar2);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"set_property",&local_591)
  ;
  this_03 = (cmSetPropertyCommand *)operator_new(0xa8);
  cmSetPropertyCommand::cmSetPropertyCommand(this_03);
  cmState::AddBuiltinCommand(pcVar1,&local_590,(cmCommand *)this_03);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"site_name",&local_5b9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSiteNameCommand::cmSiteNameCommand((cmSiteNameCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_5b8,pcVar2);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"string",&local_5e1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmStringCommand::cmStringCommand((cmStringCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_5e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"unset",&local_609);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmUnsetCommand::cmUnsetCommand((cmUnsetCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_608,pcVar2);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"while",&local_631);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmWhileCommand::cmWhileCommand((cmWhileCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_630,pcVar2);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"else",&local_659);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_658,
             "An ELSE command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"elseif",&local_681);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_680,"An ELSEIF command was found outside of a proper IF ENDIF structure."
            );
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"endforeach",&local_6a9);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_6a8,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
            );
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"endfunction",&local_6d1);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_6d0,
             "An ENDFUNCTION command was found outside of a proper FUNCTION ENDFUNCTION structure. Or its arguments did not match the opening FUNCTION command."
            );
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"endif",&local_6f9);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_6f8,
             "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"endmacro",&local_721);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_720,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
            );
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"endwhile",&local_749);
  cmState::AddUnexpectedCommand
            (pcVar1,&local_748,
             "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
            );
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"cmake_host_system_information",&local_771);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmCMakeHostSystemInformationCommand::cmCMakeHostSystemInformationCommand
            ((cmCMakeHostSystemInformationCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_770,pcVar2);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"remove",&local_799);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmRemoveCommand::cmRemoveCommand((cmRemoveCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_798,pcVar2);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"variable_watch",&local_7c1);
  this_04 = (cmVariableWatchCommand *)operator_new(0x60);
  cmVariableWatchCommand::cmVariableWatchCommand(this_04);
  cmState::AddBuiltinCommand(pcVar1,&local_7c0,(cmCommand *)this_04);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"write_file",&local_7e9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmWriteFileCommand::cmWriteFileCommand((cmWriteFileCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_7e8,pcVar2);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"build_name",&local_811);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmBuildNameCommand::cmBuildNameCommand((cmBuildNameCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_810,pcVar2,CMP0036,
             "The build_name command should not be called; see CMP0036.");
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"use_mangled_mesa",&local_839);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmUseMangledMesaCommand::cmUseMangledMesaCommand((cmUseMangledMesaCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_838,pcVar2,CMP0030,
             "The use_mangled_mesa command should not be called; see CMP0030.");
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  return;
}

Assistant:

void GetScriptingCommands(cmState* state)
{
  state->AddBuiltinCommand("break", new cmBreakCommand);
  state->AddBuiltinCommand("cmake_minimum_required",
                           new cmCMakeMinimumRequired);
  state->AddBuiltinCommand("cmake_policy", new cmCMakePolicyCommand);
  state->AddBuiltinCommand("configure_file", new cmConfigureFileCommand);
  state->AddBuiltinCommand("continue", new cmContinueCommand);
  state->AddBuiltinCommand("exec_program", new cmExecProgramCommand);
  state->AddBuiltinCommand("execute_process", new cmExecuteProcessCommand);
  state->AddBuiltinCommand("file", new cmFileCommand);
  state->AddBuiltinCommand("find_file", new cmFindFileCommand);
  state->AddBuiltinCommand("find_library", new cmFindLibraryCommand);
  state->AddBuiltinCommand("find_package", new cmFindPackageCommand);
  state->AddBuiltinCommand("find_path", new cmFindPathCommand);
  state->AddBuiltinCommand("find_program", new cmFindProgramCommand);
  state->AddBuiltinCommand("foreach", new cmForEachCommand);
  state->AddBuiltinCommand("function", new cmFunctionCommand);
  state->AddBuiltinCommand("get_cmake_property",
                           new cmGetCMakePropertyCommand);
  state->AddBuiltinCommand("get_directory_property",
                           new cmGetDirectoryPropertyCommand);
  state->AddBuiltinCommand("get_filename_component",
                           new cmGetFilenameComponentCommand);
  state->AddBuiltinCommand("get_property", new cmGetPropertyCommand);
  state->AddBuiltinCommand("if", new cmIfCommand);
  state->AddBuiltinCommand("include", new cmIncludeCommand);
  state->AddBuiltinCommand("include_guard", new cmIncludeGuardCommand);
  state->AddBuiltinCommand("list", new cmListCommand);
  state->AddBuiltinCommand("macro", new cmMacroCommand);
  state->AddBuiltinCommand("make_directory", new cmMakeDirectoryCommand);
  state->AddBuiltinCommand("mark_as_advanced", new cmMarkAsAdvancedCommand);
  state->AddBuiltinCommand("math", new cmMathCommand);
  state->AddBuiltinCommand("message", new cmMessageCommand);
  state->AddBuiltinCommand("option", new cmOptionCommand);
  state->AddBuiltinCommand("cmake_parse_arguments",
                           new cmParseArgumentsCommand);
  state->AddBuiltinCommand("return", new cmReturnCommand);
  state->AddBuiltinCommand("separate_arguments",
                           new cmSeparateArgumentsCommand);
  state->AddBuiltinCommand("set", new cmSetCommand);
  state->AddBuiltinCommand("set_directory_properties",
                           new cmSetDirectoryPropertiesCommand);
  state->AddBuiltinCommand("set_property", new cmSetPropertyCommand);
  state->AddBuiltinCommand("site_name", new cmSiteNameCommand);
  state->AddBuiltinCommand("string", new cmStringCommand);
  state->AddBuiltinCommand("unset", new cmUnsetCommand);
  state->AddBuiltinCommand("while", new cmWhileCommand);

  state->AddUnexpectedCommand(
    "else",
    "An ELSE command was found outside of a proper "
    "IF ENDIF structure. Or its arguments did not match "
    "the opening IF command.");
  state->AddUnexpectedCommand(
    "elseif",
    "An ELSEIF command was found outside of a proper "
    "IF ENDIF structure.");
  state->AddUnexpectedCommand(
    "endforeach",
    "An ENDFOREACH command was found outside of a proper "
    "FOREACH ENDFOREACH structure. Or its arguments did "
    "not match the opening FOREACH command.");
  state->AddUnexpectedCommand(
    "endfunction",
    "An ENDFUNCTION command was found outside of a proper "
    "FUNCTION ENDFUNCTION structure. Or its arguments did not "
    "match the opening FUNCTION command.");
  state->AddUnexpectedCommand(
    "endif",
    "An ENDIF command was found outside of a proper "
    "IF ENDIF structure. Or its arguments did not match "
    "the opening IF command.");
  state->AddUnexpectedCommand(
    "endmacro",
    "An ENDMACRO command was found outside of a proper "
    "MACRO ENDMACRO structure. Or its arguments did not "
    "match the opening MACRO command.");
  state->AddUnexpectedCommand(
    "endwhile",
    "An ENDWHILE command was found outside of a proper "
    "WHILE ENDWHILE structure. Or its arguments did not "
    "match the opening WHILE command.");

#if defined(CMAKE_BUILD_WITH_CMAKE)
  state->AddBuiltinCommand("cmake_host_system_information",
                           new cmCMakeHostSystemInformationCommand);
  state->AddBuiltinCommand("remove", new cmRemoveCommand);
  state->AddBuiltinCommand("variable_watch", new cmVariableWatchCommand);
  state->AddBuiltinCommand("write_file", new cmWriteFileCommand);

  state->AddDisallowedCommand(
    "build_name", new cmBuildNameCommand, cmPolicies::CMP0036,
    "The build_name command should not be called; see CMP0036.");
  state->AddDisallowedCommand(
    "use_mangled_mesa", new cmUseMangledMesaCommand, cmPolicies::CMP0030,
    "The use_mangled_mesa command should not be called; see CMP0030.");

#endif
}